

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void double_suite::test_same_no_increment(void)

{
  undefined8 local_168;
  value_type local_160 [2];
  undefined8 local_150;
  value_type local_148 [2];
  undefined8 local_138;
  value_type local_130 [2];
  undefined8 local_120;
  value_type local_118 [2];
  undefined8 local_108;
  value_type local_100 [2];
  undefined8 local_f0;
  value_type local_e8 [2];
  undefined8 local_d8;
  value_type local_d0 [2];
  undefined8 local_c0;
  value_type local_b8 [2];
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined1 local_78 [8];
  covariance<double,_4> filter;
  
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78,2.0,2.0);
  local_88[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x102,"void double_suite::test_same_no_increment()",local_88,&local_90);
  local_a0[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_a8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x103,"void double_suite::test_same_no_increment()",local_a0,&local_a8);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78,2.0,2.0);
  local_b8[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x105,"void double_suite::test_same_no_increment()",local_b8,&local_c0);
  local_d0[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_d8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x106,"void double_suite::test_same_no_increment()",local_d0,&local_d8);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78,2.0,2.0);
  local_e8[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_f0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x108,"void double_suite::test_same_no_increment()",local_e8,&local_f0);
  local_100[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_108 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x109,"void double_suite::test_same_no_increment()",local_100,&local_108);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78,2.0,2.0);
  local_118[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                 variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x10b,"void double_suite::test_same_no_increment()",local_118,&local_120);
  local_130[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_138 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x10c,"void double_suite::test_same_no_increment()",local_130,&local_138);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78,2.0,2.0);
  local_148[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                 variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_150 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x10e,"void double_suite::test_same_no_increment()",local_148,&local_150);
  local_160[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                 unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_78);
  local_168 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x10f,"void double_suite::test_same_no_increment()",local_160,&local_168);
  return;
}

Assistant:

void test_same_no_increment()
{
    window::covariance<double, 4> filter;
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
}